

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O1

bool __thiscall
QOpenGLTextureBlitterPrivate::prepareProgram
          (QOpenGLTextureBlitterPrivate *this,QMatrix4x4 *vertexTransform)

{
  float *pfVar1;
  float value;
  GLenum GVar2;
  bool bVar3;
  socklen_t in_ECX;
  socklen_t __len;
  sockaddr *__addr;
  sockaddr *__addr_00;
  ProgramIndex __fd;
  int location;
  undefined8 *puVar4;
  ProgramIndex idx;
  long in_FS_OFFSET;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GVar2 = this->currentTarget;
  if (GVar2 == 0xde1) {
    idx = TEXTURE_2D;
  }
  else if (GVar2 == 0x84f5) {
    idx = TEXTURE_RECTANGLE;
  }
  else if (GVar2 == 0x8d65) {
    idx = TEXTURE_EXTERNAL_OES;
  }
  else {
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_38 = "default";
    idx = TEXTURE_2D;
    QMessageLogger::warning(local_50,"Unsupported texture target 0x%x");
  }
  __fd = idx;
  bVar3 = ensureProgram(this,idx);
  if (bVar3) {
    puVar4 = (undefined8 *)((long)&this->programs[0].glProgram.d + (ulong)(idx * 0x30));
    QOpenGLBuffer::bind(&this->vertexBuffer,__fd,__addr,in_ECX);
    __len = 0;
    QOpenGLShaderProgram::setAttributeBuffer
              ((QOpenGLShaderProgram *)*puVar4,
               *(int *)((long)&this->programs[0].vertexCoordAttribPos + (ulong)(idx * 0x30)),0x1406,
               0,3,0);
    QOpenGLShaderProgram::enableAttributeArray
              ((QOpenGLShaderProgram *)*puVar4,
               *(int *)((long)&this->programs[0].vertexCoordAttribPos + (ulong)(idx * 0x30)));
    QOpenGLBuffer::release(&this->vertexBuffer);
    location = *(int *)((long)&this->programs[0].vertexTransformUniformPos + (ulong)(idx * 0x30));
    QOpenGLShaderProgram::setUniformValue((QOpenGLShaderProgram *)*puVar4,location,vertexTransform);
    QOpenGLBuffer::bind(&this->textureBuffer,location,__addr_00,__len);
    QOpenGLShaderProgram::setAttributeBuffer
              ((QOpenGLShaderProgram *)*puVar4,
               *(int *)((long)&this->programs[0].textureCoordAttribPos + (ulong)(idx * 0x30)),0x1406
               ,0,2,0);
    QOpenGLShaderProgram::enableAttributeArray
              ((QOpenGLShaderProgram *)*puVar4,
               *(int *)((long)&this->programs[0].textureCoordAttribPos + (ulong)(idx * 0x30)));
    QOpenGLBuffer::release(&this->textureBuffer);
    if (this->swizzle != (&this->programs[0].swizzle)[idx * 0x30]) {
      QOpenGLShaderProgram::setUniformValue
                ((QOpenGLShaderProgram *)*puVar4,
                 *(int *)((long)&this->programs[0].swizzleUniformPos + (ulong)(idx * 0x30)),
                 (uint)this->swizzle);
      (&this->programs[0].swizzle)[idx * 0x30] = this->swizzle;
    }
    value = this->opacity;
    pfVar1 = (float *)((long)&this->programs[0].opacity + (ulong)(idx * 0x30));
    if ((value != *pfVar1) || (NAN(value) || NAN(*pfVar1))) {
      QOpenGLShaderProgram::setUniformValue
                ((QOpenGLShaderProgram *)*puVar4,
                 *(int *)((long)&this->programs[0].opacityUniformPos + (ulong)(idx * 0x30)),value);
      *(float *)((long)&this->programs[0].opacity + (ulong)(idx * 0x30)) = this->opacity;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QOpenGLTextureBlitterPrivate::prepareProgram(const QMatrix4x4 &vertexTransform)
{
    ProgramIndex programIndex = targetToProgramIndex(currentTarget);
    if (!ensureProgram(programIndex))
        return false;

    Program *program = &programs[programIndex];

    vertexBuffer.bind();
    program->glProgram->setAttributeBuffer(program->vertexCoordAttribPos, GL_FLOAT, 0, 3, 0);
    program->glProgram->enableAttributeArray(program->vertexCoordAttribPos);
    vertexBuffer.release();

    program->glProgram->setUniformValue(program->vertexTransformUniformPos, vertexTransform);

    textureBuffer.bind();
    program->glProgram->setAttributeBuffer(program->textureCoordAttribPos, GL_FLOAT, 0, 2, 0);
    program->glProgram->enableAttributeArray(program->textureCoordAttribPos);
    textureBuffer.release();

    if (swizzle != program->swizzle) {
        program->glProgram->setUniformValue(program->swizzleUniformPos, swizzle);
        program->swizzle = swizzle;
    }

    if (opacity != program->opacity) {
        program->glProgram->setUniformValue(program->opacityUniformPos, opacity);
        program->opacity = opacity;
    }

    return true;
}